

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloat
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  ostringstream *this_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  StateQueryMemoryWriteGuard<int> state;
  undefined1 local_1a0 [384];
  
  fVar2 = floorf(reference + 0.5);
  fVar3 = ceilf(reference + -0.5);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&state,testCtx)
  ;
  if (bVar1) {
    if ((int)fVar2 < state.m_value || state.m_value < (int)fVar3) {
      local_1a0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "// ERROR: expected rounding to the nearest integer, valid range [");
      std::ostream::operator<<(this_00,(int)fVar3);
      std::operator<<((ostream *)this_00,",");
      std::ostream::operator<<(this_00,(int)fVar2);
      std::operator<<((ostream *)this_00,"]; got ");
      std::ostream::operator<<(this_00,state.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloat (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	using tcu::TestLog;

	const GLint expectedGLStateMax = StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<GLint>(reference);
	const GLint expectedGLStateMin = StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<GLint>(reference);

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected rounding to the nearest integer, valid range [" << expectedGLStateMin << "," << expectedGLStateMax << "]; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}